

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::WriteLinearOffsets
          (BamStandardIndex *this,int *refId,BaiLinearOffsetVector *linearOffsets)

{
  IBamIODevice *pIVar1;
  ulong *puVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar5;
  BamException *this_00;
  ulong *puVar6;
  long lVar7;
  int32_t offsetCount;
  uint64_t linearOffset;
  uint local_74;
  string local_70;
  string local_50;
  
  SortLinearOffsets(this,linearOffsets);
  uVar4 = (long)(linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
  local_74 = (uint)(uVar4 >> 3);
  if (this->m_isBigEndian == true) {
    local_74 = local_74 << 0x18 | (int)local_74 >> 0x18 | (local_74 & 0xff00) << 8 |
               (uint)(uVar4 >> 0xb) & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_74,4);
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_70._M_dataplus._M_p._0_4_ =
       (int)((ulong)((long)(linearOffsets->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(linearOffsets->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start) >> 3);
  SaveLinearOffsetsSummary(this,refId,(int *)&local_70);
  puVar5 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar5;
  if (puVar5 != puVar2) {
    do {
      local_70._M_dataplus._M_p = (pointer)*puVar5;
      if (this->m_isBigEndian == true) {
        local_70._M_dataplus._M_p =
             (pointer)((ulong)local_70._M_dataplus._M_p >> 0x38 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff000000000000) >> 0x28 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff0000000000) >> 0x18 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff00000000) >> 8 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff000000) << 8 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff0000) << 0x18 |
                       ((ulong)local_70._M_dataplus._M_p & 0xff00) << 0x28 |
                      (long)local_70._M_dataplus._M_p << 0x38);
      }
      pIVar1 = (this->m_resources).Device;
      iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_70,8);
      lVar7 = lVar7 + CONCAT44(extraout_var_00,iVar3);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    puVar5 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    puVar6 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
  }
  if (lVar7 != (long)puVar5 + (4 - (long)puVar6)) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"BamStandardIndex::WriteLinearOffsets","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"could not write BAI linear offsets","");
    BamException::BamException(this_00,&local_70,&local_50);
    __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteLinearOffsets(const int& refId, BaiLinearOffsetVector& linearOffsets) {

    // make sure linear offsets are sorted before writing & saving summary
    SortLinearOffsets(linearOffsets);

    int64_t numBytesWritten = 0;

    // write number of linear offsets
    int32_t offsetCount = linearOffsets.size();
    if ( m_isBigEndian ) SwapEndian_32(offsetCount);
    numBytesWritten += m_resources.Device->Write((const char*)&offsetCount, sizeof(offsetCount));

    // save summary for reference's linear offsets
    SaveLinearOffsetsSummary(refId, linearOffsets.size());

    // iterate over linear offsets
    BaiLinearOffsetVector::const_iterator offsetIter = linearOffsets.begin();
    BaiLinearOffsetVector::const_iterator offsetEnd  = linearOffsets.end();
    for ( ; offsetIter != offsetEnd; ++offsetIter ) {

        // write linear offset
        uint64_t linearOffset = (*offsetIter);
        if ( m_isBigEndian ) SwapEndian_64(linearOffset);
        numBytesWritten += m_resources.Device->Write((const char*)&linearOffset, sizeof(linearOffset));
    }

    if ( numBytesWritten != (sizeof(offsetCount) + linearOffsets.size()*sizeof(uint64_t)) )
        throw BamException("BamStandardIndex::WriteLinearOffsets", "could not write BAI linear offsets");
}